

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem_internal.h
# Opt level: O2

bool __thiscall
bssl::Vector<bssl::CertCompressionAlg>::MaybeGrow(Vector<bssl::CertCompressionAlg> *this)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  ulong uVar3;
  CertCompressionAlg *pCVar4;
  size_t sVar5;
  undefined8 uVar6;
  CertCompressionAlg *pCVar7;
  long lVar8;
  bool bVar9;
  int line;
  size_t sVar10;
  
  uVar3 = this->capacity_;
  bVar9 = true;
  if (this->size_ < uVar3) {
    return true;
  }
  if (uVar3 == 0) {
    sVar10 = 0x10;
LAB_001539b0:
    pCVar7 = (CertCompressionAlg *)OPENSSL_malloc(sVar10 * 0x18);
    if (pCVar7 == (CertCompressionAlg *)0x0) {
      bVar9 = false;
    }
    else {
      pCVar4 = this->data_;
      sVar5 = this->size_;
      for (lVar8 = 0; sVar5 * 0x18 - lVar8 != 0; lVar8 = lVar8 + 0x18) {
        puVar1 = (undefined8 *)((long)&pCVar4->compress + lVar8);
        puVar2 = (undefined8 *)((long)&pCVar7->compress + lVar8);
        puVar2[2] = puVar1[2];
        uVar6 = puVar1[1];
        *puVar2 = *puVar1;
        puVar2[1] = uVar6;
      }
      clear(this);
      this->data_ = pCVar7;
      this->size_ = sVar5;
      this->capacity_ = sVar10;
    }
  }
  else {
    if ((long)uVar3 < 0) {
      line = 0x14d;
    }
    else {
      if (uVar3 < 0x555555555555556) {
        sVar10 = uVar3 * 2;
        goto LAB_001539b0;
      }
      line = 0x153;
    }
    bVar9 = false;
    ERR_put_error(0xe,0,0x45,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/../crypto/mem_internal.h"
                  ,line);
  }
  return bVar9;
}

Assistant:

bool MaybeGrow() {
    // No need to grow if we have room for one more T.
    if (size_ < capacity_) {
      return true;
    }
    size_t new_capacity = kDefaultSize;
    if (capacity_ > 0) {
      // Double the array's size if it's safe to do so.
      if (capacity_ > SIZE_MAX / 2) {
        OPENSSL_PUT_ERROR(CRYPTO, ERR_R_OVERFLOW);
        return false;
      }
      new_capacity = capacity_ * 2;
    }
    if (new_capacity > SIZE_MAX / sizeof(T)) {
      OPENSSL_PUT_ERROR(CRYPTO, ERR_R_OVERFLOW);
      return false;
    }
    T *new_data =
        reinterpret_cast<T *>(OPENSSL_malloc(new_capacity * sizeof(T)));
    if (new_data == nullptr) {
      return false;
    }
    size_t new_size = size_;
    std::uninitialized_move(begin(), end(), new_data);
    clear();
    data_ = new_data;
    size_ = new_size;
    capacity_ = new_capacity;
    return true;
  }